

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O0

void __thiscall
spatial_region::fout_bz(spatial_region *this,ofstream *pfout,int n0,int n,openmode mode)

{
  bool bVar1;
  int iVar2;
  cellb ***pppcVar3;
  ostream *poVar4;
  ostream *poVar5;
  int in_ECX;
  int in_EDX;
  ostream *in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  int unaff_retaddr;
  int k_1;
  int j;
  int j_1;
  int k;
  int i;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  openmode in_stack_ffffffffffffffb4;
  int local_30;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int iVar6;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  bVar1 = is_mode_non_binary(in_stack_ffffffffffffffb4);
  if (bVar1) {
    for (; in_EDX < in_ECX; in_EDX = in_EDX + 1) {
      iVar2 = *(int *)(in_RDI + 8) / 2;
      for (iVar6 = 0; iVar6 < *(int *)(in_RDI + 4); iVar6 = iVar6 + 1) {
        poVar5 = in_RSI;
        pppcVar3 = field3d<cellb>::operator[]
                             ((field3d<cellb> *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffac);
        poVar4 = (ostream *)std::ostream::operator<<(in_RSI,(*pppcVar3)[iVar6][iVar2].bz);
        std::operator<<(poVar4,"\n");
        in_RSI = poVar5;
      }
      iVar2 = *(int *)(in_RDI + 4) / 2;
      for (local_30 = 0; local_30 < *(int *)(in_RDI + 8); local_30 = local_30 + 1) {
        poVar5 = in_RSI;
        pppcVar3 = field3d<cellb>::operator[]
                             ((field3d<cellb> *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffac);
        poVar4 = (ostream *)std::ostream::operator<<(in_RSI,(*pppcVar3)[iVar2][local_30].bz);
        std::operator<<(poVar4,"\n");
        in_RSI = poVar5;
      }
    }
  }
  else {
    bVar1 = is_mode_binary(in_stack_ffffffffffffffb4);
    if (bVar1) {
      write_binary<cellb>((ofstream *)in_RSI,(field3d<cellb> *)CONCAT44(in_EDX,in_ECX),
                          (_func_double_field3d<cellb>_ptr_int_int_int *)
                          CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
                          in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,unaff_retaddr);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"fout_bz: ERROR: wrong mode");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void spatial_region::fout_bz(ofstream* pfout, int n0, int n, ios_base::openmode
        mode)
{
    /* n-n0 - длина массива по x (для данного spatial_region'а) для
     * вывода сечения плоскостью xy и плоскостью xz */
    if (is_mode_non_binary(mode)) {
        for(int i=n0;i<n;i++)
        {
            int k=nz/2;
            for(int j=0;j<ny;j++)
                (*pfout)<<cb[i][j][k].bz<<"\n";
            int j=ny/2;
            for(int k=0;k<nz;k++)
                (*pfout)<<cb[i][j][k].bz<<"\n";
        }
    } else if (is_mode_binary(mode)) {
        write_binary<cellb>(pfout, cb, getbz, n0, n, ny, nz);
    } else {
        cerr << "fout_bz: ERROR: wrong mode" << endl;
    }
}